

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

void __thiscall SharedDirectory::delete_file(SharedDirectory *this,string *name)

{
  bool bVar1;
  uintmax_t uVar2;
  iterator __position;
  Error *pEVar3;
  path p;
  path local_60;
  string local_40;
  
  bVar1 = can_read_file(this,name);
  if (!bVar1) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar3,"The file is not deletable");
    __cxa_throw(pEVar3,&Error::typeinfo,std::exception::~exception);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  path_in_dir(&local_60,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = boost::filesystem::exists(&local_60);
  if (bVar1) {
    uVar2 = boost::filesystem::file_size(&local_60);
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)this,name);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)this,__position);
    this->remaining_space = this->remaining_space + uVar2;
    boost::filesystem::remove((char *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  pEVar3 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(pEVar3,"The file does not exist");
  __cxa_throw(pEVar3,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void SharedDirectory::delete_file(const std::string &name) {
  if (!can_read_file(name)) {
    throw Error("The file is not deletable");
  }
  path p = path_in_dir(name);
  if (!exists(p)) {
    throw Error("The file does not exist");
  }

  uint64_t size = file_size(p);
  indexed_files.erase(indexed_files.find(name));
  remaining_space += size;
  remove(p);
}